

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O1

hugeint_t duckdb::Hugeint::Convert<double>(double value)

{
  bool bVar1;
  OutOfRangeException *this;
  hugeint_t result;
  hugeint_t local_20;
  
  bVar1 = TryConvert<double>(value,&local_20);
  if (bVar1) {
    return local_20;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  OutOfRangeException::OutOfRangeException(this,value,DOUBLE,INT128);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static hugeint_t Convert(T value) {
		hugeint_t result;
		if (!TryConvert(value, result)) { // LCOV_EXCL_START
			throw OutOfRangeException(double(value), GetTypeId<T>(), GetTypeId<hugeint_t>());
		} // LCOV_EXCL_STOP
		return result;
	}